

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

int64_t tar_atol256(char *_p,size_t char_cnt)

{
  byte local_32;
  byte local_31;
  uchar neg;
  char *pcStack_30;
  uchar c;
  uchar *p;
  uint64_t l;
  size_t char_cnt_local;
  char *_p_local;
  
  local_31 = *_p;
  pcStack_30 = _p;
  l = char_cnt;
  if ((local_31 & 0x40) == 0) {
    local_32 = 0;
    local_31 = local_31 & 0x7f;
    p = (uchar *)0x0;
  }
  else {
    local_32 = 0xff;
    local_31 = local_31 | 0x80;
    p = (uchar *)0xffffffffffffffff;
  }
  while( true ) {
    if (l < 9) {
      if (((local_31 ^ local_32) & 0x80) == 0) {
        while (l = l - 1, l != 0) {
          p = (uchar *)((long)p << 8 | (ulong)local_31);
          local_31 = pcStack_30[1];
          pcStack_30 = pcStack_30 + 1;
        }
        _p_local = (char *)((long)p << 8 | (ulong)local_31);
      }
      else {
        _p_local = (char *)0x7fffffffffffffff;
        if (local_32 != 0) {
          _p_local = (char *)0x8000000000000000;
        }
      }
      return (int64_t)_p_local;
    }
    l = l - 1;
    if (local_31 != local_32) break;
    local_31 = pcStack_30[1];
    pcStack_30 = pcStack_30 + 1;
  }
  if (local_32 == 0) {
    return 0x7fffffffffffffff;
  }
  return -0x8000000000000000;
}

Assistant:

static int64_t
tar_atol256(const char *_p, size_t char_cnt)
{
	uint64_t l;
	const unsigned char *p = (const unsigned char *)_p;
	unsigned char c, neg;

	/* Extend 7-bit 2s-comp to 8-bit 2s-comp, decide sign. */
	c = *p;
	if (c & 0x40) {
		neg = 0xff;
		c |= 0x80;
		l = ~ARCHIVE_LITERAL_ULL(0);
	} else {
		neg = 0;
		c &= 0x7f;
		l = 0;
	}

	/* If more than 8 bytes, check that we can ignore
	 * high-order bits without overflow. */
	while (char_cnt > sizeof(int64_t)) {
		--char_cnt;
		if (c != neg)
			return neg ? INT64_MIN : INT64_MAX;
		c = *++p;
	}

	/* c is first byte that fits; if sign mismatch, return overflow */
	if ((c ^ neg) & 0x80) {
		return neg ? INT64_MIN : INT64_MAX;
	}

	/* Accumulate remaining bytes. */
	while (--char_cnt > 0) {
		l = (l << 8) | c;
		c = *++p;
	}
	l = (l << 8) | c;
	/* Return signed twos-complement value. */
	return (int64_t)(l);
}